

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  TargetType TVar7;
  cmGeneratorTarget *this_00;
  char *pcVar8;
  cmSourceFile *this_01;
  char *pcVar9;
  string tLocation;
  string depLocation;
  string name;
  undefined1 local_b8 [40];
  string local_90;
  string local_70;
  string local_50;
  
  cmsys::SystemTools::GetFilenameName(&local_50,inName);
  iVar6 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar6 == 0) {
    bVar5 = false;
    goto LAB_00276e8d;
  }
  cmsys::SystemTools::GetFilenameLastExtension((string *)local_b8,&local_50);
  iVar6 = std::__cxx11::string::compare(local_b8);
  pcVar2 = local_b8 + 0x10;
  if ((pointer)local_b8._0_8_ != pcVar2) {
    operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
  }
  if (iVar6 == 0) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_b8,&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_b8);
    if ((pointer)local_b8._0_8_ != pcVar2) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
  }
  this_00 = FindGeneratorTargetToUse(this,&local_50);
  if (this_00 == (cmGeneratorTarget *)0x0) {
LAB_00276dbf:
    bVar3 = true;
LAB_00276dc1:
    bVar5 = true;
  }
  else {
    bVar5 = cmsys::SystemTools::FileIsFullPath((inName->_M_dataplus)._M_p);
    if (!bVar5) {
LAB_00276d72:
      TVar7 = cmGeneratorTarget::GetType(this_00);
      if (UNKNOWN_LIBRARY < TVar7) goto LAB_00276dbf;
      if ((0x10fU >> (TVar7 & 0x1f) & 1) == 0) {
        bVar3 = false;
        bVar5 = false;
        goto LAB_00276dca;
      }
      pcVar9 = cmGeneratorTarget::GetLocation(this_00,config);
      pcVar8 = (char *)dep->_M_string_length;
      strlen(pcVar9);
      bVar3 = false;
      std::__cxx11::string::_M_replace((ulong)dep,0,pcVar8,(ulong)pcVar9);
      goto LAB_00276dc1;
    }
    local_b8._8_8_ = (char *)0x0;
    local_b8[0x10] = '\0';
    local_b8._0_8_ = pcVar2;
    TVar7 = cmGeneratorTarget::GetType(this_00);
    if ((-1 < (int)TVar7) && (TVar7 = cmGeneratorTarget::GetType(this_00), (int)TVar7 < 4)) {
      pcVar8 = cmGeneratorTarget::GetLocation(this_00,config);
      uVar4 = local_b8._8_8_;
      strlen(pcVar8);
      std::__cxx11::string::_M_replace((ulong)local_b8,0,(char *)uVar4,(ulong)pcVar8);
      cmsys::SystemTools::GetFilenamePath(&local_90,(string *)local_b8);
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::CollapseFullPath(&local_90,(string *)local_b8);
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    paVar1 = &local_70.field_2;
    pcVar2 = (inName->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + inName->_M_string_length);
    cmsys::SystemTools::GetFilenamePath(&local_90,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::CollapseFullPath(&local_70,&local_90);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar5 = true;
    if (local_90._M_string_length == local_b8._8_8_) {
      if ((char *)local_90._M_string_length == (char *)0x0) {
        bVar5 = false;
      }
      else {
        iVar6 = bcmp(local_90._M_dataplus._M_p,(void *)local_b8._0_8_,local_90._M_string_length);
        bVar5 = iVar6 != 0;
      }
    }
    if (!bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
      }
      goto LAB_00276d72;
    }
    std::__cxx11::string::_M_assign((string *)dep);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
    if (!bVar5) goto LAB_00276d72;
    bVar5 = true;
    bVar3 = false;
  }
LAB_00276dca:
  if (bVar3) {
    bVar5 = cmsys::SystemTools::FileIsFullPath((inName->_M_dataplus)._M_p);
    if (bVar5) {
      bVar5 = true;
      std::__cxx11::string::_M_assign((string *)dep);
    }
    else {
      this_01 = cmMakefile::GetSource(this->Makefile,inName);
      if (this_01 == (cmSourceFile *)0x0) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_b8,&this->StateSnapshot);
        pcVar9 = cmStateDirectory::GetCurrentSource((cmStateDirectory *)local_b8);
        pcVar8 = (char *)dep->_M_string_length;
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)dep,0,pcVar8,(ulong)pcVar9);
        std::__cxx11::string::append((char *)dep);
        bVar5 = true;
        std::__cxx11::string::_M_append((char *)dep,(ulong)(inName->_M_dataplus)._M_p);
      }
      else {
        cmSourceFile::GetFullPath(this_01,(string *)0x0);
        bVar5 = true;
        std::__cxx11::string::_M_assign((string *)dep);
      }
    }
  }
LAB_00276e8d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if (name == "") {
    return false;
  }

  if (cmSystemTools::GetFilenameLastExtension(name) == ".exe") {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
  }

  // Look for a CMake target with the given name.
  if (cmGeneratorTarget* target = this->FindGeneratorTargetToUse(name)) {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if (cmSystemTools::FileIsFullPath(inName.c_str())) {
      std::string tLocation;
      if (target->GetType() >= cmStateEnums::EXECUTABLE &&
          target->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
      }
      std::string depLocation =
        cmSystemTools::GetFilenamePath(std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if (depLocation != tLocation) {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
      }
    }
    switch (target->GetType()) {
      case cmStateEnums::EXECUTABLE:
      case cmStateEnums::STATIC_LIBRARY:
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::UNKNOWN_LIBRARY:
        dep = target->GetLocation(config);
        return true;
      case cmStateEnums::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmStateEnums::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmStateEnums::UTILITY:
      case cmStateEnums::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
    }
  }

  // The name was not that of a CMake target.  It must name a file.
  if (cmSystemTools::FileIsFullPath(inName.c_str())) {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
  }

  // Check for a source file in this directory that matches the
  // dependency.
  if (cmSourceFile* sf = this->Makefile->GetSource(inName)) {
    dep = sf->GetFullPath();
    return true;
  }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = this->StateSnapshot.GetDirectory().GetCurrentSource();
  dep += "/";
  dep += inName;
  return true;
}